

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

bool __thiscall
QGraphicsItemPrivate::discardUpdateRequest
          (QGraphicsItemPrivate *this,bool ignoreVisibleBit,bool ignoreDirtyBit,bool ignoreOpacity)

{
  bool bVar1;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  QGraphicsItemPrivate *in_RDI;
  QGraphicsItemPrivate *in_stack_ffffffffffffffd8;
  bool local_19;
  bool local_c;
  
  local_c = true;
  if (((in_RDI->scene != (QGraphicsScene *)0x0) &&
      ((((*(ulong *)&in_RDI->field_0x160 >> 5 & 1) != 0 || ((in_SIL & 1) != 0)) ||
       (local_c = true, ((uint)((ulong)*(undefined8 *)&in_RDI->field_0x160 >> 0x39) & 1) != 0)))) &&
     (((in_DL & 1) != 0 || (local_c = true, (*(ulong *)&in_RDI->field_0x160 >> 0x1f & 1) == 0)))) {
    local_19 = false;
    if (((in_CL & 1) == 0) &&
       (local_19 = false, ((uint)((ulong)*(undefined8 *)&in_RDI->field_0x160 >> 0x3a) & 1) == 0)) {
      bVar1 = childrenCombineOpacity(in_RDI);
      local_19 = false;
      if (bVar1) {
        local_19 = isFullyTransparent(in_stack_ffffffffffffffd8);
      }
    }
    local_c = local_19;
  }
  return local_c;
}

Assistant:

bool QGraphicsItemPrivate::discardUpdateRequest(bool ignoreVisibleBit, bool ignoreDirtyBit,
                                                bool ignoreOpacity) const
{
    // No scene, or if the scene is updating everything, means we have nothing
    // to do. The only exception is if the scene tracks the growing scene rect.
    return !scene
           || (!visible && !ignoreVisibleBit && !this->ignoreVisible)
           || (!ignoreDirtyBit && fullUpdatePending)
           || (!ignoreOpacity && !this->ignoreOpacity && childrenCombineOpacity() && isFullyTransparent());
}